

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip.cpp
# Opt level: O0

int zmq::get_peer_ip_address(fd_t sockfd_,string *ip_addr_)

{
  int iVar1;
  int *piVar2;
  string *in_RSI;
  bool bVar3;
  anon_union_128_2_abdb208a u;
  int rc;
  char host [1025];
  char *errstr;
  zmq_socklen_t addrlen;
  sockaddr_storage ss;
  undefined7 in_stack_fffffffffffffac8;
  undefined1 in_stack_fffffffffffffacf;
  ushort uVar4;
  socket_end_t in_stack_fffffffffffffad0;
  fd_t in_stack_fffffffffffffad4;
  char local_4a8 [1032];
  char *local_a0;
  zmq_socklen_t local_94;
  sockaddr local_90 [8];
  string *local_10;
  uint local_4;
  
  local_10 = in_RSI;
  local_94 = get_socket_address(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0,
                                (sockaddr_storage *)
                                CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8));
  uVar4 = (ushort)in_stack_fffffffffffffad0;
  if (local_94 == 0) {
    piVar2 = __errno_location();
    bVar3 = false;
    if (*piVar2 != 9) {
      piVar2 = __errno_location();
      bVar3 = false;
      if (*piVar2 != 0xe) {
        piVar2 = __errno_location();
        bVar3 = *piVar2 != 0x58;
      }
    }
    if (!bVar3) {
      piVar2 = __errno_location();
      local_a0 = strerror(*piVar2);
      fprintf(_stderr,"%s (%s:%d)\n",local_a0,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/ip.cpp"
              ,0xb7);
      fflush(_stderr);
      zmq_abort((char *)0x1e46c4);
    }
    local_4 = 0;
  }
  else {
    iVar1 = getnameinfo(local_90,local_94,local_4a8,0x401,(char *)0x0,0,1);
    if (iVar1 == 0) {
      std::__cxx11::string::operator=(local_10,local_4a8);
      memcpy(&stack0xfffffffffffffad0,local_90,0x80);
      local_4 = (uint)uVar4;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int zmq::get_peer_ip_address (fd_t sockfd_, std::string &ip_addr_)
{
    struct sockaddr_storage ss;

    const zmq_socklen_t addrlen =
      get_socket_address (sockfd_, socket_end_remote, &ss);

    if (addrlen == 0) {
#ifdef ZMQ_HAVE_WINDOWS
        const int last_error = WSAGetLastError ();
        wsa_assert (last_error != WSANOTINITIALISED && last_error != WSAEFAULT
                    && last_error != WSAEINPROGRESS
                    && last_error != WSAENOTSOCK);
#elif !defined(TARGET_OS_IPHONE) || !TARGET_OS_IPHONE
        errno_assert (errno != EBADF && errno != EFAULT && errno != ENOTSOCK);
#else
        errno_assert (errno != EFAULT && errno != ENOTSOCK);
#endif
        return 0;
    }

    char host[NI_MAXHOST];
    const int rc =
      getnameinfo (reinterpret_cast<struct sockaddr *> (&ss), addrlen, host,
                   sizeof host, NULL, 0, NI_NUMERICHOST);
    if (rc != 0)
        return 0;

    ip_addr_ = host;

    union
    {
        struct sockaddr sa;
        struct sockaddr_storage sa_stor;
    } u;

    u.sa_stor = ss;
    return static_cast<int> (u.sa.sa_family);
}